

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

void write_cdata(char *s,int length)

{
  byte bVar1;
  uchar *puVar2;
  int local_2c;
  uchar c;
  int linelength;
  uchar *e;
  uchar *w;
  int length_local;
  char *s_local;
  
  if (varused_test == 0) {
    if (write_sourceview == 0) {
      if (length == -1) {
        fprintf((FILE *)code_file,"{ /* ... undefined size binary data... */ }");
      }
      else {
        local_2c = 1;
        putc(0x7b,(FILE *)code_file);
        e = (uchar *)s;
        while (e < s + length) {
          puVar2 = e + 1;
          bVar1 = *e;
          if (bVar1 < 100) {
            if (bVar1 < 10) {
              local_2c = local_2c + 2;
            }
            else {
              local_2c = local_2c + 3;
            }
          }
          else {
            local_2c = local_2c + 4;
          }
          if (0x4c < local_2c) {
            fputs("\n",(FILE *)code_file);
            local_2c = 0;
          }
          fprintf((FILE *)code_file,"%d",(ulong)bVar1);
          e = puVar2;
          if (puVar2 < s + length) {
            putc(0x2c,(FILE *)code_file);
          }
        }
        putc(0x7d,(FILE *)code_file);
      }
    }
    else if (length < 0) {
      fprintf((FILE *)code_file,"{ /* ... binary data... */ }");
    }
    else {
      fprintf((FILE *)code_file,"{ /* ... %d bytes of binary data... */ }",(ulong)(uint)length);
    }
  }
  else {
    varused = 1;
  }
  return;
}

Assistant:

void write_cdata(const char *s, int length) {
  if (varused_test) {
    varused = 1;
    return;
  }
  if (write_sourceview) {
    if (length>=0)
      fprintf(code_file, "{ /* ... %d bytes of binary data... */ }", length);
    else
      fprintf(code_file, "{ /* ... binary data... */ }");
    return;
  }
  if (length==-1) {
    fprintf(code_file, "{ /* ... undefined size binary data... */ }");
    return;
  }
  const unsigned char *w = (const unsigned char *)s;
  const unsigned char *e = w+length;
  int linelength = 1;
  putc('{', code_file);
  for (; w < e;) {
    unsigned char c = *w++;
    if (c>99) linelength += 4;
    else if (c>9) linelength += 3;
    else linelength += 2;
    if (linelength >= 77) {fputs("\n",code_file); linelength = 0;}
    fprintf(code_file, "%d", c);
    if (w<e) putc(',', code_file);
  }
  putc('}', code_file);
}